

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

wchar_t prt_stat_short(wchar_t stat,wchar_t row,wchar_t col)

{
  char *pcVar1;
  size_t sVar2;
  uint8_t attr;
  char tmp [32];
  
  if (player->stat_cur[(uint)stat] < player->stat_max[(uint)stat]) {
    pcVar1 = format("%c:",(ulong)(uint)(int)*stat_names_reduced[(uint)stat]);
    put_str(pcVar1,row,col);
    cnv_stat((player->state).stat_use[(uint)stat],tmp,0x20);
    strskip(tmp,' ','\0');
    attr = '\v';
  }
  else {
    pcVar1 = format("%c:",(ulong)(uint)(int)*stat_names[(uint)stat]);
    put_str(pcVar1,row,col);
    cnv_stat((player->state).stat_use[(uint)stat],tmp,0x20);
    strskip(tmp,' ','\0');
    if (player->stat_max[(uint)stat] == 0x76) {
      attr = '\x0e';
    }
    else {
      attr = '\r';
    }
  }
  c_put_str(attr,tmp,row,col + L'\x02');
  sVar2 = strlen(tmp);
  return (int)sVar2 + L'\x03';
}

Assistant:

static int prt_stat_short(int stat, int row, int col)
{
	char tmp[32];

	/* Injured or healthy stat */
	if (player->stat_cur[stat] < player->stat_max[stat]) {
		put_str(format("%c:", stat_names_reduced[stat][0]), row, col);		
		cnv_stat(player->state.stat_use[stat], tmp, sizeof(tmp));
		/* Trim whitespace */
		strskip(tmp,' ', 0);
		c_put_str(COLOUR_YELLOW, tmp, row, col + 2);
	} else {
		put_str(format("%c:", stat_names[stat][0]), row, col);
		cnv_stat(player->state.stat_use[stat], tmp, sizeof(tmp));
		/* Trim whitespace */
		strskip(tmp,' ', 0);
		if (player->stat_max[stat] == 18+100) {
			c_put_str(COLOUR_L_BLUE, tmp, row, col + 2);
		}
		else {
			c_put_str(COLOUR_L_GREEN, tmp, row, col + 2);	
		}		
	}

	return 3+strlen(tmp);
}